

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Makowski.hpp
# Opt level: O1

HRRDoubletStep * __thiscall
Makowski_HRR::DoubletStep_
          (HRRDoubletStep *__return_storage_ptr__,Makowski_HRR *this,Doublet *target,
          RRStepType steptype)

{
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Gaussian *pGVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int *piVar8;
  runtime_error *this_00;
  long lVar9;
  XYZStep XVar10;
  Gaussian *pGVar11;
  int iVar12;
  ulong uVar13;
  string tag;
  Doublet src1d;
  Doublet src2d;
  reverse_iterator<const_int_*> it;
  ExpList ijk;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  Gaussian *local_120;
  DoubletType local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  int local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  Gaussian *local_d8;
  int iStack_d0;
  int iStack_cc;
  undefined4 uStack_c8;
  undefined8 uStack_c4;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  Gaussian *local_98;
  undefined4 uStack_90;
  int iStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  Gaussian *local_58;
  Gaussian *local_50;
  long local_48;
  undefined8 local_40;
  int local_38;
  undefined1 local_34 [4];
  
  local_140 = local_130;
  pcVar1 = (target->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,pcVar1,pcVar1 + (target->tag)._M_string_length);
  if ((target->right).ijk._M_elems[0] + (target->left).ijk._M_elems[1] +
      (target->left).ijk._M_elems[2] + (target->left).ijk._M_elems[0] +
      (target->right).ijk._M_elems[1] + (target->right).ijk._M_elems[2] == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot HRR step to an s doublet!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50 = &target->left;
  local_58 = &target->right;
  pGVar11 = local_58;
  pGVar5 = local_50;
  if ((steptype & ~K) == I) {
    pGVar11 = local_50;
    pGVar5 = local_58;
  }
  local_38 = (pGVar11->ijk)._M_elems[2];
  local_40 = *(undefined8 *)(pGVar11->ijk)._M_elems;
  std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&local_40,local_34);
  piVar8 = std::
           __find_if<int*,__gnu_cxx::__ops::_Iter_pred<Makowski_HRR::DoubletStep_(Doublet_const&,RRStepType)::_lambda(int)_1_>>
                     (&local_40,local_34);
  local_d8 = pGVar11 + 1;
  local_98 = pGVar11;
  std::__find_if<std::reverse_iterator<int_const*>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
            (&local_48,&local_d8,&local_98,piVar8);
  uVar13 = (long)(pGVar11 + 1) - local_48;
  iStack_d0 = (pGVar11->ijk)._M_elems[2];
  local_d8 = *(Gaussian **)(pGVar11->ijk)._M_elems;
  lVar9 = (long)(uVar13 * -0x40000000 + 0x200000000) >> 0x20;
  piVar8 = (int *)((long)&local_d8 + lVar9 * 4);
  *piVar8 = *piVar8 + -1;
  iVar12 = iStack_d0;
  local_120 = local_d8;
  iStack_d0 = (pGVar5->ijk)._M_elems[2];
  local_d8 = *(Gaussian **)(pGVar5->ijk)._M_elems;
  piVar8 = (int *)((long)&local_d8 + lVar9 * 4);
  *piVar8 = *piVar8 + 1;
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = 0;
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  uStack_114 = SUB84(local_d8,0);
  uStack_110 = (undefined4)((ulong)local_d8 >> 0x20);
  local_108 = SUB84(local_120,0);
  uStack_104 = (undefined4)((ulong)local_120 >> 0x20);
  if ((steptype & ~K) == I) {
    local_118 = target->type;
    iStack_10c = iVar12;
    local_100 = iStack_d0;
    uVar6 = uStack_114;
    uStack_114 = local_108;
    uVar7 = uStack_110;
    uStack_110 = uStack_104;
    local_108 = uVar6;
    uStack_104 = uVar7;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_140,local_140 + local_138);
    local_d8 = (Gaussian *)CONCAT44(uStack_114,local_118);
    uStack_c4 = CONCAT44(local_100,uStack_104);
    uStack_c8 = local_108;
    iStack_d0 = uStack_110;
    iStack_cc = iStack_10c;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)local_f8);
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0]);
    }
    local_118 = target->type;
    uStack_114 = SUB84(local_120,0);
    uStack_110 = (undefined4)((ulong)local_120 >> 0x20);
    iStack_10c = iVar12;
    uVar2 = *(undefined8 *)(local_58->ijk)._M_elems;
    local_108 = (undefined4)uVar2;
    uStack_104 = (undefined4)((ulong)uVar2 >> 0x20);
    local_100 = (local_58->ijk)._M_elems[2];
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_140,local_140 + local_138);
  }
  else {
    local_118 = target->type;
    iStack_10c = iStack_d0;
    local_100 = iVar12;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_140,local_140 + local_138);
    local_d8 = (Gaussian *)CONCAT44(uStack_114,local_118);
    uStack_c4 = CONCAT44(local_100,uStack_104);
    uStack_c8 = local_108;
    iStack_d0 = uStack_110;
    iStack_cc = iStack_10c;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)local_f8);
    if (local_f8[0] != local_e8) {
      operator_delete(local_f8[0]);
    }
    local_118 = target->type;
    uVar2 = *(undefined8 *)(local_50->ijk)._M_elems;
    uStack_114 = (undefined4)uVar2;
    uStack_110 = (undefined4)((ulong)uVar2 >> 0x20);
    iStack_10c = (local_50->ijk)._M_elems[2];
    local_108 = SUB84(local_120,0);
    uStack_104 = (undefined4)((ulong)local_120 >> 0x20);
    local_100 = iVar12;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_140,local_140 + local_138);
  }
  local_98 = (Gaussian *)CONCAT44(uStack_114,local_118);
  uStack_84 = CONCAT44(local_100,uStack_104);
  uStack_88 = local_108;
  uStack_90 = uStack_110;
  iStack_8c = iStack_10c;
  std::__cxx11::string::operator=((string *)&local_78,(string *)local_f8);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  iVar12 = (int)(uVar13 >> 2);
  XVar10 = STEP_X;
  if (iVar12 != 2) {
    XVar10 = (iVar12 != 1) + STEP_Y;
  }
  __return_storage_ptr__->type = steptype;
  iVar12 = (target->left).ijk._M_elems[0];
  uVar2 = *(undefined8 *)((target->left).ijk._M_elems + 1);
  uVar3 = *(undefined8 *)((target->left).ijk._M_elems + 2);
  uVar4 = *(undefined8 *)((target->right).ijk._M_elems + 1);
  (__return_storage_ptr__->target).type = target->type;
  (__return_storage_ptr__->target).left.ijk._M_elems[0] = iVar12;
  *(undefined8 *)((__return_storage_ptr__->target).left.ijk._M_elems + 1) = uVar2;
  *(undefined8 *)((__return_storage_ptr__->target).left.ijk._M_elems + 2) = uVar3;
  *(undefined8 *)((__return_storage_ptr__->target).right.ijk._M_elems + 1) = uVar4;
  (__return_storage_ptr__->target).tag._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->target).tag.field_2;
  pcVar1 = (target->tag)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->target).tag,pcVar1,
             pcVar1 + (target->tag)._M_string_length);
  *(ulong *)((__return_storage_ptr__->src)._M_elems[0].left.ijk._M_elems + 2) =
       CONCAT44(uStack_c8,iStack_cc);
  *(undefined8 *)((__return_storage_ptr__->src)._M_elems[0].right.ijk._M_elems + 1) = uStack_c4;
  *(Gaussian **)(__return_storage_ptr__->src)._M_elems = local_d8;
  *(ulong *)((__return_storage_ptr__->src)._M_elems[0].left.ijk._M_elems + 1) =
       CONCAT44(iStack_cc,iStack_d0);
  (__return_storage_ptr__->src)._M_elems[0].tag._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->src)._M_elems[0].tag.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->src)._M_elems[0].tag,local_b8,local_b8 + local_b0);
  *(ulong *)((__return_storage_ptr__->src)._M_elems[1].left.ijk._M_elems + 2) =
       CONCAT44(uStack_88,iStack_8c);
  *(undefined8 *)((__return_storage_ptr__->src)._M_elems[1].right.ijk._M_elems + 1) = uStack_84;
  *(Gaussian **)((__return_storage_ptr__->src)._M_elems + 1) = local_98;
  *(ulong *)((__return_storage_ptr__->src)._M_elems[1].left.ijk._M_elems + 1) =
       CONCAT44(iStack_8c,uStack_90);
  (__return_storage_ptr__->src)._M_elems[1].tag._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->src)._M_elems[1].tag.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->src)._M_elems[1].tag,local_78,local_78 + local_70);
  __return_storage_ptr__->xyz = XVar10;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual HRRDoubletStep DoubletStep_(const Doublet & target, RRStepType steptype)
        {
            const std::string tag = target.tag;

            if(target.am() == 0)
                throw std::runtime_error("Cannot HRR step to an s doublet!");

            const Gaussian * t;
            const Gaussian * t2;

            if(steptype == RRStepType::I || steptype == RRStepType::K)  // Going J->I or L->K
            {
                t = &target.left;
                t2 = &target.right;
            }
            else // Going I->J or K->L
            {
                t = &target.right;
                t2 = &target.left;
            }
                

            // idx is the xyz index
            ExpList ijk = t->ijk;
            std::sort(ijk.begin(), ijk.end());
            auto v = std::find_if(ijk.begin(), ijk.end(), [](int i) { return i != 0; });
            auto it = std::find(t->ijk.rbegin(), t->ijk.rend(), *v); 
            int idx = 2 - std::distance(t->ijk.rbegin(), it);  // remember we are working with reverse iterators

            // gaussian common to both src1 and src2
            Gaussian common(t->StepDown(idx, 1));

            // for src1
            Gaussian src1g(t2->StepUp(idx, 1));

            // create new doublets
            Doublet src1d, src2d;
            if(steptype == RRStepType::I || steptype == RRStepType::K)
            {
                src1d = Doublet{target.type, common, src1g, tag};
                src2d = Doublet{target.type, common, target.right, tag};
            }
            else
            {
                src1d = Doublet{target.type, src1g, common, tag};
                src2d = Doublet{target.type, target.left, common, tag};
            }
           
            XYZStep xyzstep = IdxToXYZStep(idx);

            // Create the HRR doublet step
            HRRDoubletStep hrr{steptype,
                               target, 
                               src1d, src2d,
                               xyzstep};
            return hrr;
        }